

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.cpp
# Opt level: O0

int main(void)

{
  reference_wrapper<(anonymous_namespace)::ListenerTaskTwo> local_9e58;
  undefined1 local_9e50 [8];
  jthread listener2_thread;
  undefined1 local_9e38 [8];
  jthread listener_thread;
  undefined1 local_9e20 [8];
  jthread producer_thread;
  ListenerTaskTwo listener_task2;
  ListenerTask listener_task;
  ProducerTask producer_task;
  deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_> local_168;
  undefined1 local_118 [8];
  Queue<(anonymous_namespace)::Action> queue;
  
  local_168.
  super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_168.
  super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_168.
  super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_168.
  super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_168.
  super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_168.
  super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_168.
  super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_168.
  super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_168.
  super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_168.
  super__Deque_base<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>::deque
            (&local_168);
  mq::Queue<(anonymous_namespace)::Action>::
  Queue<std::deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>_>
            ((Queue<(anonymous_namespace)::Action> *)local_118,&local_168,100);
  std::deque<(anonymous_namespace)::Action,_std::allocator<(anonymous_namespace)::Action>_>::~deque
            (&local_168);
  anon_unknown.dwarf_ace6::ProducerTask::ProducerTask
            ((ProducerTask *)&listener_task.q,(Queue<(anonymous_namespace)::Action> *)local_118);
  anon_unknown.dwarf_ace6::ListenerTask::ListenerTask
            ((ListenerTask *)&listener_task2.q,(Queue<(anonymous_namespace)::Action> *)local_118);
  anon_unknown.dwarf_ace6::ListenerTaskTwo::ListenerTaskTwo
            ((ListenerTaskTwo *)&producer_thread._M_thread,
             (Queue<(anonymous_namespace)::Action> *)local_118);
  listener_thread._M_thread._M_id._M_thread =
       (id)std::ref<(anonymous_namespace)::ProducerTask>((ProducerTask *)&listener_task.q);
  std::jthread::jthread<std::reference_wrapper<(anonymous_namespace)::ProducerTask>,,void>
            ((jthread *)local_9e20,
             (reference_wrapper<(anonymous_namespace)::ProducerTask> *)&listener_thread._M_thread);
  listener2_thread._M_thread._M_id._M_thread =
       (id)std::ref<(anonymous_namespace)::ListenerTask>((ListenerTask *)&listener_task2.q);
  std::jthread::jthread<std::reference_wrapper<(anonymous_namespace)::ListenerTask>,,void>
            ((jthread *)local_9e38,
             (reference_wrapper<(anonymous_namespace)::ListenerTask> *)&listener2_thread._M_thread);
  local_9e58 = std::ref<(anonymous_namespace)::ListenerTaskTwo>
                         ((ListenerTaskTwo *)&producer_thread._M_thread);
  std::jthread::jthread<std::reference_wrapper<(anonymous_namespace)::ListenerTaskTwo>,,void>
            ((jthread *)local_9e50,&local_9e58);
  std::jthread::~jthread((jthread *)local_9e50);
  std::jthread::~jthread((jthread *)local_9e38);
  std::jthread::~jthread((jthread *)local_9e20);
  anon_unknown.dwarf_ace6::ListenerTaskTwo::~ListenerTaskTwo
            ((ListenerTaskTwo *)&producer_thread._M_thread);
  anon_unknown.dwarf_ace6::ListenerTask::~ListenerTask((ListenerTask *)&listener_task2.q);
  anon_unknown.dwarf_ace6::ProducerTask::~ProducerTask((ProducerTask *)&listener_task.q);
  mq::Queue<(anonymous_namespace)::Action>::~Queue
            ((Queue<(anonymous_namespace)::Action> *)local_118);
  return 0;
}

Assistant:

int main() {
    mq::Queue queue{std::deque<Action>{}, 100};  // NOLINT
    ProducerTask producer_task{queue};
    ListenerTask listener_task{queue};
    ListenerTaskTwo listener_task2{queue};

    std::jthread producer_thread{std::ref(producer_task)};
    std::jthread listener_thread{std::ref(listener_task)};
    std::jthread listener2_thread{std::ref(listener_task2)};
}